

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

string * __thiscall
cmCPackIFWPackage::DependenceStruct::NameWithCompare_abi_cxx11_
          (string *__return_storage_ptr__,DependenceStruct *this)

{
  uint uVar1;
  
  uVar1 = (this->Compare).Type;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  if (uVar1 != 0) {
    if (((this->Compare).Type != 0) || ((this->Compare).Value._M_string_length != 0)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((this->Compare).Type - 1 < 5) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWPackage::DependenceStruct::NameWithCompare() const
{
  if (this->Compare.Type == cmCPackIFWPackage::CompareNone) {
    return this->Name;
  }

  std::string result = this->Name;

  if (this->Compare.Type != cmCPackIFWPackage::CompareNone ||
      !this->Compare.Value.empty()) {
    result += "-";
  }

  if (this->Compare.Type == cmCPackIFWPackage::CompareLessOrEqual) {
    result += "<=";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareGreaterOrEqual) {
    result += ">=";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareLess) {
    result += "<";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareEqual) {
    result += "=";
  } else if (this->Compare.Type == cmCPackIFWPackage::CompareGreater) {
    result += ">";
  }

  result += this->Compare.Value;

  return result;
}